

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O3

void deqp::gles3::Functional::anon_unknown_0::verifyImages
               (TestLog *log,TestContext *testCtx,RenderContext *renderCtx,
               ConstPixelBufferAccess *testImage,ConstPixelBufferAccess *referenceImage)

{
  ulong uVar1;
  TextureFormat TVar2;
  TextureFormat TVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  ulong uVar8;
  ConstPixelBufferAccess *pCVar9;
  byte bVar10;
  int iVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  uint uVar12;
  uint uVar13;
  void *data;
  int iVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  IVec4 cTest;
  int kYmin;
  Vector<bool,_4> res;
  Surface diffMask;
  IVec4 cRef;
  int local_2b4;
  undefined1 local_2a8 [40];
  int local_280;
  uint local_27c;
  undefined1 local_278 [40];
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  uint local_22c;
  uint local_228;
  int local_224;
  int local_220;
  int local_21c;
  ConstPixelBufferAccess *local_218;
  string local_210;
  Surface local_1f0;
  TestContext *local_1d8;
  TextureFormat local_1d0;
  int local_1c8;
  int iStack_1c4;
  int iStack_1c0;
  int iStack_1bc;
  undefined1 local_1b8 [8];
  int iStack_1b0;
  int iStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  long lVar6;
  
  local_218 = testImage;
  local_1d8 = testCtx;
  tcu::Surface::Surface(&local_1f0,(testImage->m_size).m_data[0],(testImage->m_size).m_data[1]);
  local_1b8._0_4_ = RGBA;
  local_1b8._4_4_ = UNORM_INT8;
  data = (void *)local_1f0.m_pixels.m_cap;
  if ((void *)local_1f0.m_pixels.m_cap != (void *)0x0) {
    data = local_1f0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_278,(TextureFormat *)local_1b8,local_1f0.m_width,
             local_1f0.m_height,1,data);
  local_248 = (ulong)(uint)(referenceImage->m_size).m_data[0];
  local_250 = (ulong)(uint)(referenceImage->m_size).m_data[1];
  iVar5 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  lVar6 = CONCAT44(extraout_var,iVar5);
  uVar13 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  bVar10 = 8 - *(char *)(lVar6 + 8);
  if (*(int *)(lVar6 + 0x14) < 1) {
    uVar13 = 0;
  }
  uVar12 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar10 & 0x1f);
  uVar13 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar12 | uVar13;
  tcu::clear((PixelBufferAccess *)local_278,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK
            );
  if ((int)local_250 < 1) {
    local_2b4 = -1;
    iVar5 = 0;
  }
  else {
    local_1c8 = (1 << (bVar10 & 0x1f) & 0xffU) + 0x80;
    iStack_1c4 = (uVar12 >> 8 & 0xff) + 0x80;
    iStack_1c0 = (uVar13 >> 0x10 & 0xff) + 0x80;
    iStack_1bc = (uVar13 >> 0x18) + (uint)(0xffffff < uVar13) * 0x80;
    local_22c = (int)local_250 - 1;
    local_220 = (int)local_248 + -1;
    local_2b4 = -1;
    uVar13 = 0;
    iVar5 = 0;
    uVar8 = local_250;
    do {
      if ((int)(uint)local_248 < 1) {
        uVar13 = uVar13 + 1;
      }
      else {
        uVar12 = 1;
        if (1 < (int)uVar13) {
          uVar12 = uVar13;
        }
        local_280 = uVar12 - 1;
        local_228 = uVar13 + 1;
        local_27c = local_22c;
        if ((int)local_228 < (int)local_22c) {
          local_27c = local_228;
        }
        uVar7 = 0;
        local_240 = (ulong)uVar13;
        do {
          iVar14 = (int)local_240;
          iVar11 = (int)uVar7;
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1b8,(int)local_218,iVar11,iVar14);
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_2a8,(int)referenceImage,iVar11,iVar14);
          uVar13 = (int)(local_1b8._0_4_ - local_2a8._0_4_) >> 0x1f;
          uVar12 = (int)(local_1b8._4_4_ - local_2a8._4_4_) >> 0x1f;
          uVar18 = iStack_1b0 - local_2a8._8_4_ >> 0x1f;
          uVar19 = iStack_1ac - local_2a8._12_4_ >> 0x1f;
          auVar16._0_4_ =
               -(uint)(local_1c8 < (int)((local_1b8._0_4_ - local_2a8._0_4_ ^ uVar13) - uVar13));
          auVar16._4_4_ =
               -(uint)(iStack_1c4 < (int)((local_1b8._4_4_ - local_2a8._4_4_ ^ uVar12) - uVar12));
          auVar16._8_4_ =
               -(uint)(iStack_1c0 < (int)((iStack_1b0 - local_2a8._8_4_ ^ uVar18) - uVar18));
          auVar16._12_4_ =
               -(uint)(iStack_1bc < (int)((iStack_1ac - local_2a8._12_4_ ^ uVar19) - uVar19));
          auVar16 = packssdw(auVar16,auVar16);
          auVar16 = packsswb(auVar16 ^ _DAT_01bce6f0,auVar16 ^ _DAT_01bce6f0);
          uVar13 = auVar16._0_4_ & (uint)DAT_01b805f0;
          local_210._M_dataplus._M_p._0_4_ = uVar13;
          local_238 = uVar7;
          if ((char)uVar13 == '\0') {
LAB_0124ea95:
            iVar14 = 1;
            if (1 < iVar11) {
              iVar14 = iVar11;
            }
            iVar4 = iVar11 + 1;
            if (local_220 <= iVar11 + 1) {
              iVar4 = local_220;
            }
            if (local_280 <= (int)local_27c) {
              local_21c = iVar14 + -1;
              bVar15 = false;
              iVar11 = local_21c;
              iVar14 = local_280;
              do {
                for (; local_224 = iVar5, iVar11 <= iVar4; iVar11 = iVar11 + 1) {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)local_2a8,(int)referenceImage,iVar11,iVar14);
                  uVar13 = (int)(local_1b8._0_4_ - local_2a8._0_4_) >> 0x1f;
                  uVar12 = (int)(local_1b8._4_4_ - local_2a8._4_4_) >> 0x1f;
                  uVar18 = iStack_1b0 - local_2a8._8_4_ >> 0x1f;
                  uVar19 = iStack_1ac - local_2a8._12_4_ >> 0x1f;
                  auVar17._0_4_ =
                       -(uint)(local_1c8 <
                              (int)((local_1b8._0_4_ - local_2a8._0_4_ ^ uVar13) - uVar13));
                  auVar17._4_4_ =
                       -(uint)(iStack_1c4 <
                              (int)((local_1b8._4_4_ - local_2a8._4_4_ ^ uVar12) - uVar12));
                  auVar17._8_4_ =
                       -(uint)(iStack_1c0 < (int)((iStack_1b0 - local_2a8._8_4_ ^ uVar18) - uVar18))
                  ;
                  auVar17._12_4_ =
                       -(uint)(iStack_1bc < (int)((iStack_1ac - local_2a8._12_4_ ^ uVar19) - uVar19)
                              );
                  auVar16 = packssdw(auVar17,auVar17);
                  auVar16 = packsswb(auVar16 ^ _DAT_01bce6f0,auVar16 ^ _DAT_01bce6f0);
                  uVar13 = auVar16._0_4_ & (uint)DAT_01b805f0;
                  local_210._M_dataplus._M_p._0_4_ = uVar13;
                  if ((char)uVar13 != '\0') {
                    uVar8 = 0xffffffffffffffff;
                    do {
                      if (uVar8 == 2) goto LAB_0124eb75;
                      uVar7 = uVar8 + 1;
                      lVar6 = uVar8 + 2;
                      uVar8 = uVar7;
                    } while (*(char *)((long)&local_210._M_dataplus._M_p + lVar6) != '\0');
                    if (2 < uVar7) {
LAB_0124eb75:
                      bVar15 = true;
                    }
                  }
                  iVar5 = local_224;
                }
                iVar14 = iVar14 + 1;
                iVar11 = local_21c;
              } while (iVar14 <= (int)local_27c);
              iVar11 = (int)local_238;
              if (bVar15) {
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)local_278,
                           (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_DEV,iVar11,
                           (int)local_240,0);
                uVar8 = local_250;
                if (local_2b4 == -1) {
                  local_2b4 = 0;
                }
                goto LAB_0124ec0a;
              }
            }
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_278,
                       (Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,iVar11,
                       (int)local_240,0);
            iVar5 = iVar5 + 1;
            local_2b4 = 1;
            uVar8 = local_250;
          }
          else {
            uVar7 = 0xffffffffffffffff;
            do {
              if (uVar7 == 2) goto LAB_0124ec0a;
              uVar1 = uVar7 + 1;
              lVar6 = uVar7 + 2;
              uVar7 = uVar1;
            } while (*(char *)((long)&local_210._M_dataplus._M_p + lVar6) != '\0');
            if (uVar1 < 3) goto LAB_0124ea95;
          }
LAB_0124ec0a:
          uVar7 = (ulong)(iVar11 + 1U);
          uVar13 = local_228;
        } while (iVar11 + 1U != (uint)local_248);
      }
    } while (uVar13 != (uint)uVar8);
  }
  local_1b8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
  std::ostream::operator<<((ostringstream *)&iStack_1b0,iVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&iStack_1b0," faulty pixel(s) found.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (local_2b4 != 1) {
    iVar5 = local_2b4;
  }
  if (0x14 < iVar5) {
    TVar2 = (TextureFormat)((long)local_278 + 0x10);
    local_278._0_8_ = TVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Images","");
    TVar3 = (TextureFormat)((long)local_2a8 + 0x10);
    local_2a8._0_8_ = TVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Image comparison","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_1b8,(string *)local_278,(string *)local_2a8);
    tcu::TestLog::startImageSet(log,(char *)local_1b8,local_198._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_2a8._0_8_ != TVar3) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar2) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_278._0_8_ = TVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Test image","");
    local_2a8._0_8_ = TVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Test image","");
    pCVar9 = local_218;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_278,(string *)local_2a8,local_218,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar11 = (int)log;
    tcu::LogImage::write((LogImage *)local_1b8,iVar11,__buf,(size_t)pCVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_2a8._0_8_ != TVar3) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar2) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_278._0_8_ = TVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Reference image","");
    local_2a8._0_8_ = TVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Reference image","");
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_278,(string *)local_2a8,referenceImage,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,iVar11,__buf_00,(size_t)referenceImage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_2a8._0_8_ != TVar3) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    if ((TextureFormat)local_278._0_8_ != TVar2) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    local_2a8._0_8_ = TVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Difference mask","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Difference mask","");
    local_1d0.order = RGBA;
    local_1d0.type = UNORM_INT8;
    if ((void *)local_1f0.m_pixels.m_cap != (void *)0x0) {
      local_1f0.m_pixels.m_cap = (size_t)local_1f0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_278,&local_1d0,local_1f0.m_width,local_1f0.m_height,1,
               (void *)local_1f0.m_pixels.m_cap);
    pCVar9 = (ConstPixelBufferAccess *)local_278;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b8,(string *)local_2a8,&local_210,pCVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_1b8,iVar11,__buf_01,(size_t)pCVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_2a8._0_8_ != TVar3) {
      operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
    }
    tcu::TestLog::endImageSet(log);
    local_1b8 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_1b0,"Got ",4);
    std::ostream::operator<<((ostringstream *)&iStack_1b0,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&iStack_1b0," faulty pixel(s).",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
    std::ios_base::~ios_base(local_140);
    tcu::TestContext::setTestResult(local_1d8,QP_TEST_RESULT_FAIL,"Got faulty pixels");
  }
  tcu::Surface::~Surface(&local_1f0);
  return;
}

Assistant:

void verifyImages (tcu::TestLog& log, tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const tcu::ConstPixelBufferAccess& testImage, const tcu::ConstPixelBufferAccess& referenceImage)
{
	using tcu::TestLog;

	const int			kernelRadius		= 1;
	const int			faultyPixelLimit	= 20;
	int					faultyPixels;
	tcu::Surface		diffMask			(testImage.getWidth(), testImage.getHeight());

	faultyPixels = compareImages(log, renderCtx, referenceImage, testImage, diffMask.getAccess(), kernelRadius);

	if (faultyPixels > faultyPixelLimit)
	{
		log << TestLog::ImageSet("Images", "Image comparison");
		log << TestLog::Image("Test image", "Test image", testImage);
		log << TestLog::Image("Reference image", "Reference image", referenceImage);
		log << TestLog::Image("Difference mask", "Difference mask", diffMask.getAccess());
		log << TestLog::EndImageSet;

		log << tcu::TestLog::Message << "Got " << faultyPixels << " faulty pixel(s)." << tcu::TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got faulty pixels");
	}
}